

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBox::~QDialogButtonBox(QDialogButtonBox *this)

{
  QDialogButtonBoxPrivate *this_00;
  pointer in_RDI;
  QDialogButtonBoxPrivate *unaff_retaddr;
  QDialogButtonBoxPrivate *d;
  QWidget *in_stack_00000078;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d19638;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QDialogButtonBox_00d197e8;
  this_00 = d_func((QDialogButtonBox *)0x66d1da);
  this_00->ignoreShowAndHide = true;
  QDialogButtonBoxPrivate::disconnectAll(unaff_retaddr);
  std::unique_ptr<QObject,_std::default_delete<QObject>_>::reset
            ((unique_ptr<QObject,_std::default_delete<QObject>_> *)this_00,in_RDI);
  QWidget::~QWidget(in_stack_00000078);
  return;
}

Assistant:

QDialogButtonBox::~QDialogButtonBox()
{
    Q_D(QDialogButtonBox);

    d->ignoreShowAndHide = true;

    // QObjectPrivate::connect requires explicit disconnect in destructor
    // otherwise the connection may kick in on child destruction and reach
    // the parent's destroyed private object
    d->disconnectAll();
    // ditto event filter:
    d->filter.reset();
}